

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
          (GeneratedCodeInfo_Annotation *this)

{
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffffb8;
  InternalMetadataWithArena *in_stack_ffffffffffffffc0;
  GeneratedCodeInfo_Annotation *this_00;
  
  Message::Message((Message *)in_stack_ffffffffffffffc0);
  *in_RDI = &PTR__GeneratedCodeInfo_Annotation_0089aaf0;
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  memset(in_RDI + 2,0,4);
  internal::CachedSize::CachedSize((CachedSize *)0x69f512);
  this_00 = (GeneratedCodeInfo_Annotation *)(in_RDI + 3);
  RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_00);
  SharedCtor(this_00);
  return;
}

Assistant:

GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation()
  : ::PROTOBUF_NAMESPACE_ID::Message(), _internal_metadata_(nullptr) {
  SharedCtor();
  // @@protoc_insertion_point(constructor:google.protobuf.GeneratedCodeInfo.Annotation)
}